

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

bool google::protobuf::internal::WireFormat::ParseAndMergeMessageSetField
               (uint32 field_number,FieldDescriptor *field,Message *message,CodedInputStream *input)

{
  uint8 *puVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  Type TVar5;
  undefined4 extraout_var;
  long *plVar6;
  LogMessage *other;
  UnknownFieldSet *unknown_fields;
  pair<int,_int> pVar7;
  LogFinisher local_61;
  LogMessage local_60;
  
  iVar4 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  plVar6 = (long *)CONCAT44(extraout_var,iVar4);
  if (field == (FieldDescriptor *)0x0) {
    unknown_fields = (UnknownFieldSet *)(**(code **)(*plVar6 + 0x18))(plVar6,message);
    bVar3 = SkipMessageSetField(input,field_number,unknown_fields);
    return bVar3;
  }
  if ((*(int *)(field + 0x4c) == 3) || (TVar5 = FieldDescriptor::type(field), TVar5 != TYPE_MESSAGE)
     ) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x1d3);
    other = LogMessage::operator<<(&local_60,"Extensions of MessageSets must be optional messages.")
    ;
    LogFinisher::operator=(&local_61,other);
    LogMessage::~LogMessage(&local_60);
    return false;
  }
  plVar6 = (long *)(**(code **)(*plVar6 + 0x138))(plVar6,message,field,input->extension_factory_);
  puVar1 = input->buffer_;
  if ((puVar1 < input->buffer_end_) && (iVar4 = (int)(char)*puVar1, -1 < (char)*puVar1)) {
    input->buffer_ = puVar1 + 1;
  }
  else {
    iVar4 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
    if (iVar4 < 0) {
      return false;
    }
  }
  pVar7 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar4);
  if ((long)pVar7 < 0) {
    return false;
  }
  cVar2 = (**(code **)(*plVar6 + 0x58))(plVar6,input);
  if (cVar2 == '\0') {
    return false;
  }
  bVar3 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar7.first);
  return bVar3;
}

Assistant:

bool WireFormat::ParseAndMergeMessageSetField(uint32 field_number,
                                              const FieldDescriptor* field,
                                              Message* message,
                                              io::CodedInputStream* input) {
  const Reflection* message_reflection = message->GetReflection();
  if (field == NULL) {
    // We store unknown MessageSet extensions as groups.
    return SkipMessageSetField(
        input, field_number, message_reflection->MutableUnknownFields(message));
  } else if (field->is_repeated() ||
             field->type() != FieldDescriptor::TYPE_MESSAGE) {
    // This shouldn't happen as we only allow optional message extensions to
    // MessageSet.
    GOOGLE_LOG(ERROR) << "Extensions of MessageSets must be optional messages.";
    return false;
  } else {
    Message* sub_message = message_reflection->MutableMessage(
        message, field, input->GetExtensionFactory());
    return WireFormatLite::ReadMessage(input, sub_message);
  }
}